

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIntegerMixTests.cpp
# Opt level: O3

qpTestResult __thiscall deqp::ShaderIntegerMixDefineCase::test(ShaderIntegerMixDefineCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  qpTestResult qVar7;
  undefined4 uVar8;
  undefined4 extraout_var;
  char *pcVar9;
  mapped_type *pmVar10;
  byte bVar11;
  long lVar12;
  string code;
  GLint compileSuccess;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  char *strings [1];
  string local_d0;
  GLSLVersion local_b0;
  uint local_ac;
  string local_a8;
  long local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  StringTemplate local_50;
  
  iVar6 = (*((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  bVar5 = glu::glslVersionIsES((this->super_ShaderIntegerMixCase).m_glslVersion);
  local_b0 = GLSL_VERSION_330;
  if (bVar5) {
    local_b0 = GLSL_VERSION_300_ES;
  }
  bVar5 = glu::ContextInfo::isExtensionSupported
                    (((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_contextInfo,
                     "GL_EXT_shader_integer_mix");
  qVar7 = QP_TEST_RESULT_NOT_SUPPORTED;
  if (bVar5) {
    paVar1 = &local_d0.field_2;
    local_ac = 1;
    lVar12 = 0;
    bVar11 = 1;
    local_88 = CONCAT44(extraout_var,iVar6);
    do {
      local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_80._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_80._M_impl.super__Rb_tree_header._M_header;
      local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_80._M_impl.super__Rb_tree_header._M_header._M_right =
           local_80._M_impl.super__Rb_tree_header._M_header._M_left;
      pcVar9 = glu::getGLSLVersionDeclaration(local_b0);
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"VERSION_DECL","");
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_80,&local_d0);
      pcVar2 = (char *)pmVar10->_M_string_length;
      strlen(pcVar9);
      std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar2,(ulong)pcVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = test::shader_targets[lVar12].body;
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"BODY","");
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_80,&local_d0);
      pcVar9 = (char *)pmVar10->_M_string_length;
      strlen(pcVar2);
      std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar9,(ulong)pcVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,
                 "${VERSION_DECL}\n#extension GL_EXT_shader_integer_mix: require\n\n#if !defined GL_EXT_shader_integer_mix\n#  error GL_EXT_shader_integer_mix is not defined\n#elif GL_EXT_shader_integer_mix != 1\n#  error GL_EXT_shader_integer_mix is not equal to 1\n#endif\n\nvoid main(void) { ${BODY} }\n"
                 ,"");
      tcu::StringTemplate::StringTemplate(&local_50,&local_a8);
      tcu::StringTemplate::specialize
                (&local_d0,&local_50,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_80);
      tcu::StringTemplate::~StringTemplate(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      lVar4 = local_88;
      uVar8 = (**(code **)(local_88 + 0x3f0))(test::shader_targets[lVar12].target);
      local_50.m_template._M_dataplus._M_p = local_d0._M_dataplus._M_p;
      (**(code **)(lVar4 + 0x12b8))(uVar8,1,&local_50,0);
      (**(code **)(lVar4 + 0x248))(uVar8);
      local_a8._M_dataplus._M_p = local_a8._M_dataplus._M_p & 0xffffffff00000000;
      (**(code **)(lVar4 + 0xa70))(uVar8,0x8b81,&local_a8);
      (**(code **)(lVar4 + 0x470))(uVar8);
      if ((int)local_a8._M_dataplus._M_p == 0) {
        bVar11 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_80);
      lVar12 = 1;
      uVar3 = local_ac & 1;
      local_ac = 0;
    } while (uVar3 != 0);
    qVar7 = (qpTestResult)(~bVar11 & 1);
  }
  return qVar7;
}

Assistant:

virtual qpTestResult test()
	{
		const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
		bool				  pass = true;

		static const char source_template[] = "${VERSION_DECL}\n"
											  "#extension GL_EXT_shader_integer_mix: require\n"
											  "\n"
											  "#if !defined GL_EXT_shader_integer_mix\n"
											  "#  error GL_EXT_shader_integer_mix is not defined\n"
											  "#elif GL_EXT_shader_integer_mix != 1\n"
											  "#  error GL_EXT_shader_integer_mix is not equal to 1\n"
											  "#endif\n"
											  "\n"
											  "void main(void) { ${BODY} }\n";

		static const struct
		{
			GLenum		target;
			const char* body;
		} shader_targets[] = {
			{ GL_VERTEX_SHADER, "gl_Position = vec4(0);" }, { GL_FRAGMENT_SHADER, "" },
		};

		const glu::GLSLVersion v = glslVersionIsES(m_glslVersion) ? glu::GLSL_VERSION_300_ES : glu::GLSL_VERSION_330;

		if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_shader_integer_mix"))
			return QP_TEST_RESULT_NOT_SUPPORTED;

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(shader_targets); i++)
		{
			std::map<std::string, std::string> args;

			args["VERSION_DECL"] = glu::getGLSLVersionDeclaration(v);
			args["BODY"]		 = shader_targets[i].body;

			std::string code = tcu::StringTemplate(source_template).specialize(args);

			GLuint		shader	 = gl.createShader(shader_targets[i].target);
			char const* strings[1] = { code.c_str() };
			gl.shaderSource(shader, 1, strings, 0);
			gl.compileShader(shader);

			GLint compileSuccess = 0;
			gl.getShaderiv(shader, GL_COMPILE_STATUS, &compileSuccess);
			gl.deleteShader(shader);

			if (!compileSuccess)
				pass = false;
		}

		return pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL;
	}